

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

int __thiscall IsoWriter::allocateEntity(IsoWriter *this,FileEntryInfo *entity,int sectorNum)

{
  FileTypes FVar1;
  int iVar2;
  pointer ppFVar3;
  int iVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  mapped_type mVar7;
  FileEntryInfo **i;
  pointer ppFVar8;
  uint local_2c;
  
  FVar1 = entity->m_fileType;
  if (FVar1 == Directory) {
    this->m_totalDirectories = this->m_totalDirectories + 1;
    entity->m_sectorNum = sectorNum;
    iVar4 = 2;
  }
  else {
    if (((FVar1 == RealtimeFile) || (FVar1 == File)) && (entity->m_objectId != '\0')) {
      this->m_totalFiles = this->m_totalFiles + 1;
    }
    entity->m_sectorNum = sectorNum;
    if ((FVar1 == RealtimeFile) || (iVar4 = 2, FVar1 == File)) {
      uVar5 = (long)(entity->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(entity->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      iVar4 = 1;
      if (0x70 < uVar5) {
        iVar4 = (int)uVar5;
        iVar4 = iVar4 + (int)((ulong)((long)(iVar4 + 10) * -0x7bdef7bd) >> 0x20) + 10;
        iVar4 = ((iVar4 >> 6) - (iVar4 >> 0x1f)) + 1;
      }
    }
  }
  entity->m_sectorsUsed = iVar4;
  if (entity->m_objectId != 0) {
    iVar2 = entity->m_parent->m_sectorNum;
    local_2c = (uint)entity->m_objectId;
    pmVar6 = std::
             map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
             ::operator[](&this->m_mappingEntries,(key_type_conflict *)&local_2c);
    mVar7.LBN = sectorNum;
    mVar7.parentLBN = iVar2;
    *pmVar6 = mVar7;
  }
  iVar4 = iVar4 + sectorNum;
  ppFVar3 = (entity->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar8 = (entity->m_files).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar8 != ppFVar3; ppFVar8 = ppFVar8 + 1) {
    iVar4 = allocateEntity(this,*ppFVar8,iVar4);
  }
  ppFVar3 = (entity->m_subDirs).
            super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar8 = (entity->m_subDirs).
                 super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar8 != ppFVar3; ppFVar8 = ppFVar8 + 1) {
    iVar4 = allocateEntity(this,*ppFVar8,iVar4);
  }
  return iVar4;
}

Assistant:

int IsoWriter::allocateEntity(FileEntryInfo *entity, int sectorNum)
{
    if ((entity->m_fileType == FileTypes::File || entity->m_fileType == FileTypes::RealtimeFile) && entity->m_objectId)
        m_totalFiles++;
    else if (entity->m_fileType == FileTypes::Directory)
        m_totalDirectories++;

    sectorNum += entity->allocateEntity(sectorNum);
    if (entity->m_objectId)
        m_mappingEntries[entity->m_objectId] = MappingEntry(entity->m_parent->m_sectorNum, entity->m_sectorNum);

    for (const auto &i : entity->m_files) sectorNum = allocateEntity(i, sectorNum);
    for (const auto &i : entity->m_subDirs) sectorNum = allocateEntity(i, sectorNum);
    return sectorNum;
}